

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance>::
createInstance(TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance>
               *this,Context *context)

{
  Context *pCVar1;
  undefined8 uVar2;
  pointer pPVar3;
  WrapMode WVar4;
  VkFormat VVar5;
  TextureCubeLodControlTestInstance *this_00;
  
  this_00 = (TextureCubeLodControlTestInstance *)operator_new(0x308);
  texture::anon_unknown_0::TextureCubeLodControlTestInstance::TextureCubeLodControlTestInstance
            (this_00,context,&this->m_testsParameters);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__TextureCubeBaseLevelTestInstance_00d679f8;
  pCVar1 = *(Context **)
            &(this->m_testsParameters).super_TextureCubeTestCaseParameters.
             super_TextureCommonTestCaseParameters.minFilter;
  uVar2 = *(undefined8 *)
           &(this->m_testsParameters).super_TextureCubeTestCaseParameters.
            super_TextureCommonTestCaseParameters.magFilter;
  WVar4 = (this->m_testsParameters).super_TextureCubeTestCaseParameters.
          super_TextureCommonTestCaseParameters.wrapT;
  VVar5 = (this->m_testsParameters).super_TextureCubeTestCaseParameters.
          super_TextureCommonTestCaseParameters.format;
  this_00[1].super_TestInstance._vptr_TestInstance =
       *(_func_int ***)
        &(this->m_testsParameters).super_TextureCubeTestCaseParameters.
         super_TextureCommonTestCaseParameters;
  this_00[1].super_TestInstance.m_context = pCVar1;
  *(undefined8 *)((long)&this_00[1].super_TestInstance.m_context + 4) = uVar2;
  *(WrapMode *)&this_00[1].field_0x14 = WVar4;
  this_00[1].m_testParameters.super_TextureCubeTestCaseParameters.
  super_TextureCommonTestCaseParameters.sampleCount = VVar5;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::vector
            ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
             &this_00[1].m_testParameters.super_TextureCubeTestCaseParameters.
              super_TextureCommonTestCaseParameters.minFilter,
             &(this->m_testsParameters).super_TextureCubeTestCaseParameters.
              super_TextureCommonTestCaseParameters.programs);
  *(int *)&this_00[1].m_testParameters.super_TextureCubeTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_start =
       (this->m_testsParameters).super_TextureCubeTestCaseParameters.size;
  pPVar3 = (pointer)(this->m_testsParameters).super_TextureMipmapCommonTestCaseParameters.
                    minFilterName;
  *(pointer *)
   ((long)&this_00[1].m_testParameters.super_TextureCubeTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data + 8) =
       *(pointer *)&(this->m_testsParameters).super_TextureMipmapCommonTestCaseParameters;
  *(pointer *)
   ((long)&this_00[1].m_testParameters.super_TextureCubeTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data + 0x10) = pPVar3;
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}